

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnBrTableExpr
          (ExprVisitorDelegate *this,BrTableExpr *expr)

{
  WatWriter *this_00;
  bool bVar1;
  char *s;
  reference var_00;
  Var *var;
  iterator __end2;
  iterator __begin2;
  VarVector *__range2;
  BrTableExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::BrTable_Opcode);
  WritePutsSpace(this_00,s);
  __end2 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::begin(&expr->targets);
  var = (Var *)std::vector<wabt::Var,_std::allocator<wabt::Var>_>::end(&expr->targets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>
                                *)&var);
    if (!bVar1) break;
    var_00 = __gnu_cxx::
             __normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
             operator*(&__end2);
    WriteBrVar(this->writer_,var_00,Space);
    __gnu_cxx::__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
    operator++(&__end2);
  }
  WriteBrVar(this->writer_,&expr->default_target,Newline);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnBrTableExpr(BrTableExpr* expr) {
  writer_->WritePutsSpace(Opcode::BrTable_Opcode.GetName());
  for (const Var& var : expr->targets) {
    writer_->WriteBrVar(var, NextChar::Space);
  }
  writer_->WriteBrVar(expr->default_target, NextChar::Newline);
  return Result::Ok;
}